

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::IGXMLScanner::resetPSVIElemContext(IGXMLScanner *this)

{
  (this->fPSVIElemContext).fIsSpecified = false;
  (this->fPSVIElemContext).fErrorOccurred = false;
  (this->fPSVIElemContext).fElemDepth = -1;
  (this->fPSVIElemContext).fFullValidationDepth = -1;
  (this->fPSVIElemContext).fNoneValidationDepth = -1;
  (this->fPSVIElemContext).fCurrentDV = (DatatypeValidator *)0x0;
  (this->fPSVIElemContext).fCurrentTypeInfo = (ComplexTypeInfo *)0x0;
  (this->fPSVIElemContext).fNormalizedValue = (XMLCh *)0x0;
  return;
}

Assistant:

void IGXMLScanner::resetPSVIElemContext()
{
    fPSVIElemContext.fIsSpecified = false;
    fPSVIElemContext.fErrorOccurred = false;
    fPSVIElemContext.fElemDepth = -1;
    fPSVIElemContext.fFullValidationDepth = -1;
    fPSVIElemContext.fNoneValidationDepth = -1;
    fPSVIElemContext.fCurrentDV = 0;
    fPSVIElemContext.fCurrentTypeInfo = 0;
    fPSVIElemContext.fNormalizedValue = 0;
}